

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::QuadMvIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  BVH *bvh;
  size_t sVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar5;
  float fVar6;
  float fVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  size_t sVar20;
  bool bVar21;
  uint uVar22;
  undefined4 uVar23;
  int iVar24;
  long lVar25;
  size_t sVar26;
  long lVar27;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar28;
  NodeRef root;
  long lVar29;
  uint uVar30;
  NodeRef *pNVar31;
  size_t i_1;
  long lVar32;
  ulong uVar33;
  vint4 ai_2;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 in_ZMM0 [64];
  vint4 ai;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [64];
  vint4 bi_3;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  vint4 bi_2;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  vint4 bi_1;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  float fVar69;
  float fVar76;
  float fVar77;
  vint4 ai_1;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  float fVar78;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  vint4 ai_3;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  vint4 bi;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [64];
  uint uVar98;
  uint uVar101;
  uint uVar102;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar99;
  undefined1 auVar100 [16];
  uint uVar103;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  Precalculations pre;
  undefined1 local_3878 [16];
  RTCFilterFunctionNArguments args;
  undefined1 local_3818 [16];
  undefined1 local_3808 [16];
  Geometry *local_37f8;
  RayK<4> *local_37f0;
  undefined1 local_37e8 [16];
  vbool<4> terminated;
  undefined1 local_37c8 [8];
  float fStack_37c0;
  float fStack_37bc;
  undefined1 local_37a8 [16];
  vfloat<4> t;
  vfloat<4> v;
  vfloat<4> u;
  anon_union_48_2_4062524c_for_Vec3<embree::vfloat_impl<4>_>_1 local_3758;
  undefined1 local_3728 [8];
  float fStack_3720;
  float fStack_371c;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_3718;
  undefined1 local_3708 [16];
  undefined1 local_36f8 [16];
  uint local_36e8;
  uint uStack_36e4;
  uint uStack_36e0;
  uint uStack_36dc;
  uint uStack_36d8;
  uint uStack_36d4;
  uint uStack_36d0;
  uint uStack_36cc;
  undefined1 local_36c8 [16];
  undefined8 local_36b8;
  undefined8 uStack_36b0;
  undefined8 local_36a8;
  undefined8 uStack_36a0;
  undefined8 local_3698;
  undefined8 uStack_3690;
  undefined1 local_3688 [16];
  undefined1 local_3678 [16];
  float local_3668;
  float fStack_3664;
  float fStack_3660;
  float fStack_365c;
  float local_3658;
  float fStack_3654;
  float fStack_3650;
  float fStack_364c;
  float local_3648;
  float fStack_3644;
  float fStack_3640;
  float fStack_363c;
  float local_3638;
  float fStack_3634;
  float fStack_3630;
  float fStack_362c;
  float local_3628;
  float fStack_3624;
  float fStack_3620;
  float fStack_361c;
  Vec3vf<4> Ng;
  TravRayK<4,_false> tray;
  NodeRef stack_node [561];
  vfloat<4> stack_near [561];
  
  bvh = (BVH *)This->ptr;
  stack_node[1].ptr = (bvh->root).ptr;
  if (stack_node[1].ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar54 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar40 = vpcmpeqd_avx(auVar54,(undefined1  [16])valid_i->field_0);
    auVar34 = ZEXT816(0) << 0x40;
    auVar41 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar34,5);
    auVar60 = auVar40 & auVar41;
    if ((((auVar60 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar60 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar60 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar60[0xf] < '\0')
    {
      local_3688 = vandps_avx(auVar41,auVar40);
      tray.org.field_0._0_4_ = *(float *)ray;
      tray.org.field_0._4_4_ = *(float *)(ray + 4);
      tray.org.field_0._8_4_ = *(float *)(ray + 8);
      tray.org.field_0._12_4_ = *(float *)(ray + 0xc);
      tray.org.field_0._16_4_ = *(float *)(ray + 0x10);
      tray.org.field_0._20_4_ = *(float *)(ray + 0x14);
      tray.org.field_0._24_4_ = *(float *)(ray + 0x18);
      tray.org.field_0._28_4_ = *(float *)(ray + 0x1c);
      tray.org.field_0._32_4_ = *(float *)(ray + 0x20);
      tray.org.field_0._36_4_ = *(float *)(ray + 0x24);
      tray.org.field_0._40_4_ = *(float *)(ray + 0x28);
      tray.org.field_0._44_4_ = *(float *)(ray + 0x2c);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      local_36c8._8_4_ = 0x7fffffff;
      local_36c8._0_8_ = 0x7fffffff7fffffff;
      local_36c8._12_4_ = 0x7fffffff;
      auVar41 = vandps_avx(local_36c8,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar94._8_4_ = 0x219392ef;
      auVar94._0_8_ = 0x219392ef219392ef;
      auVar94._12_4_ = 0x219392ef;
      auVar41 = vcmpps_avx(auVar41,auVar94,1);
      auVar40 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar94,auVar41);
      auVar41 = vandps_avx(local_36c8,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar41 = vcmpps_avx(auVar41,auVar94,1);
      auVar60 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar94,auVar41);
      auVar41 = vandps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,local_36c8);
      auVar41 = vcmpps_avx(auVar41,auVar94,1);
      auVar41 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar94,auVar41);
      auVar70 = vrcpps_avx(auVar40);
      auVar95._8_4_ = 0x3f800000;
      auVar95._0_8_ = 0x3f8000003f800000;
      auVar95._12_4_ = 0x3f800000;
      auVar40 = vfnmadd213ps_fma(auVar40,auVar70,auVar95);
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar40,auVar70,auVar70)
      ;
      auVar40 = vrcpps_avx(auVar60);
      auVar60 = vfnmadd213ps_fma(auVar60,auVar40,auVar95);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar60,auVar40,auVar40)
      ;
      auVar40 = vrcpps_avx(auVar41);
      auVar41 = vfnmadd213ps_fma(auVar41,auVar40,auVar95);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar41,auVar40,auVar40)
      ;
      tray.org_rdir.field_0._0_4_ = tray.rdir.field_0._0_4_ * *(float *)ray;
      tray.org_rdir.field_0._4_4_ = tray.rdir.field_0._4_4_ * *(float *)(ray + 4);
      tray.org_rdir.field_0._8_4_ = tray.rdir.field_0._8_4_ * *(float *)(ray + 8);
      tray.org_rdir.field_0._12_4_ = tray.rdir.field_0._12_4_ * *(float *)(ray + 0xc);
      tray.org_rdir.field_0._16_4_ = *(float *)(ray + 0x10) * tray.rdir.field_0._16_4_;
      tray.org_rdir.field_0._20_4_ = *(float *)(ray + 0x14) * tray.rdir.field_0._20_4_;
      tray.org_rdir.field_0._24_4_ = *(float *)(ray + 0x18) * tray.rdir.field_0._24_4_;
      tray.org_rdir.field_0._28_4_ = *(float *)(ray + 0x1c) * tray.rdir.field_0._28_4_;
      tray.org_rdir.field_0._32_4_ = *(float *)(ray + 0x20) * tray.rdir.field_0._32_4_;
      tray.org_rdir.field_0._36_4_ = *(float *)(ray + 0x24) * tray.rdir.field_0._36_4_;
      tray.org_rdir.field_0._40_4_ = *(float *)(ray + 0x28) * tray.rdir.field_0._40_4_;
      tray.org_rdir.field_0._44_4_ = *(float *)(ray + 0x2c) * tray.rdir.field_0._44_4_;
      auVar41 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar34,1);
      auVar40._8_4_ = 0x20;
      auVar40._0_8_ = 0x2000000020;
      auVar40._12_4_ = 0x20;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar41,auVar40);
      auVar41 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar34,5);
      auVar60._8_4_ = 0x40;
      auVar60._0_8_ = 0x4000000040;
      auVar60._12_4_ = 0x40;
      auVar70._8_4_ = 0x60;
      auVar70._0_8_ = 0x6000000060;
      auVar70._12_4_ = 0x60;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar70,auVar60,auVar41);
      auVar41 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar34,5);
      auVar71._8_4_ = 0x80;
      auVar71._0_8_ = 0x8000000080;
      auVar71._12_4_ = 0x80;
      auVar79._8_4_ = 0xa0;
      auVar79._0_8_ = 0xa0000000a0;
      auVar79._12_4_ = 0xa0;
      tray.nearXYZ.field_0.field_0.z.field_0 = (vint_impl<4>)vblendvps_avx(auVar79,auVar71,auVar41);
      auVar41 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar34);
      auVar40 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar34);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar97 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar41,local_3688);
      auVar46 = ZEXT1664((undefined1  [16])tray.tnear.field_0);
      auVar41._8_4_ = 0xff800000;
      auVar41._0_8_ = 0xff800000ff800000;
      auVar41._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar41,auVar40,local_3688);
      terminated.field_0.i[1] = local_3688._4_4_ ^ auVar54._4_4_;
      terminated.field_0.i[0] = local_3688._0_4_ ^ auVar54._0_4_;
      terminated.field_0.i[2] = local_3688._8_4_ ^ auVar54._8_4_;
      terminated.field_0.i[3] = local_3688._12_4_ ^ auVar54._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar30 = 3;
      }
      else {
        uVar30 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      local_37f0 = ray + 0x80;
      pNVar31 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar28 = &stack_near[2].field_0;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      local_3698 = mm_lookupmask_ps._0_8_;
      uStack_3690 = mm_lookupmask_ps._8_8_;
      local_36a8 = mm_lookupmask_ps._240_8_;
      uStack_36a0 = mm_lookupmask_ps._248_8_;
LAB_01639e5c:
      do {
        do {
          root.ptr = pNVar31[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_0163af15;
          pNVar31 = pNVar31 + -1;
          paVar28 = paVar28 + -1;
          aVar99 = *paVar28;
          auVar41 = vcmpps_avx((undefined1  [16])aVar99,(undefined1  [16])tray.tfar.field_0,1);
          uVar22 = vmovmskps_avx(auVar41);
        } while (uVar22 == 0);
        uVar33 = (ulong)(uVar22 & 0xff);
        uVar22 = POPCOUNT(uVar22 & 0xff);
        if (uVar30 < uVar22) {
LAB_01639e9b:
          do {
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_0163af15;
              auVar41 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar99,6);
              if ((((auVar41 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar41 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar41 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar41[0xf]) goto LAB_01639e5c;
              auVar41 = vpcmpeqd_avx(auVar41,auVar41);
              lVar25 = (root.ptr & 0xfffffffffffffff0) + 0xc0;
              lVar27 = 0;
              local_37a8 = auVar41 ^ (undefined1  [16])terminated.field_0;
              goto LAB_0163a082;
            }
            sVar26 = 8;
            aVar99 = auVar97._0_16_;
            for (lVar25 = 0;
                (lVar25 != 8 &&
                (sVar2 = *(size_t *)((root.ptr & 0xfffffffffffffff0) + lVar25 * 8), sVar2 != 8));
                lVar25 = lVar25 + 1) {
              uVar23 = *(undefined4 *)(root.ptr + 0x40 + lVar25 * 4);
              auVar43._4_4_ = uVar23;
              auVar43._0_4_ = uVar23;
              auVar43._8_4_ = uVar23;
              auVar43._12_4_ = uVar23;
              auVar17._4_4_ = tray.org_rdir.field_0._4_4_;
              auVar17._0_4_ = tray.org_rdir.field_0._0_4_;
              auVar17._8_4_ = tray.org_rdir.field_0._8_4_;
              auVar17._12_4_ = tray.org_rdir.field_0._12_4_;
              auVar40 = vfmsub213ps_fma(auVar43,(undefined1  [16])
                                                tray.rdir.field_0.field_0.x.field_0,auVar17);
              uVar23 = *(undefined4 *)(root.ptr + 0x80 + lVar25 * 4);
              auVar72._4_4_ = uVar23;
              auVar72._0_4_ = uVar23;
              auVar72._8_4_ = uVar23;
              auVar72._12_4_ = uVar23;
              auVar18._4_4_ = tray.org_rdir.field_0._20_4_;
              auVar18._0_4_ = tray.org_rdir.field_0._16_4_;
              auVar18._8_4_ = tray.org_rdir.field_0._24_4_;
              auVar18._12_4_ = tray.org_rdir.field_0._28_4_;
              auVar60 = vfmsub213ps_fma(auVar72,(undefined1  [16])
                                                tray.rdir.field_0.field_0.y.field_0,auVar18);
              uVar23 = *(undefined4 *)(root.ptr + 0xc0 + lVar25 * 4);
              auVar84._4_4_ = uVar23;
              auVar84._0_4_ = uVar23;
              auVar84._8_4_ = uVar23;
              auVar84._12_4_ = uVar23;
              auVar19._4_4_ = tray.org_rdir.field_0._36_4_;
              auVar19._0_4_ = tray.org_rdir.field_0._32_4_;
              auVar19._8_4_ = tray.org_rdir.field_0._40_4_;
              auVar19._12_4_ = tray.org_rdir.field_0._44_4_;
              auVar34 = vfmsub213ps_fma(auVar84,(undefined1  [16])
                                                tray.rdir.field_0.field_0.z.field_0,auVar19);
              uVar23 = *(undefined4 *)(root.ptr + 0x60 + lVar25 * 4);
              auVar91._4_4_ = uVar23;
              auVar91._0_4_ = uVar23;
              auVar91._8_4_ = uVar23;
              auVar91._12_4_ = uVar23;
              auVar70 = vfmsub213ps_fma(auVar91,(undefined1  [16])
                                                tray.rdir.field_0.field_0.x.field_0,auVar17);
              uVar23 = *(undefined4 *)(root.ptr + 0xa0 + lVar25 * 4);
              auVar61._4_4_ = uVar23;
              auVar61._0_4_ = uVar23;
              auVar61._8_4_ = uVar23;
              auVar61._12_4_ = uVar23;
              auVar71 = vfmsub213ps_fma(auVar61,(undefined1  [16])
                                                tray.rdir.field_0.field_0.y.field_0,auVar18);
              uVar23 = *(undefined4 *)(root.ptr + 0xe0 + lVar25 * 4);
              auVar47._4_4_ = uVar23;
              auVar47._0_4_ = uVar23;
              auVar47._8_4_ = uVar23;
              auVar47._12_4_ = uVar23;
              auVar79 = vfmsub213ps_fma(auVar47,(undefined1  [16])
                                                tray.rdir.field_0.field_0.z.field_0,auVar19);
              auVar41 = vpminsd_avx(auVar40,auVar70);
              auVar54 = vpminsd_avx(auVar60,auVar71);
              auVar41 = vpmaxsd_avx(auVar41,auVar54);
              auVar54 = vpminsd_avx(auVar34,auVar79);
              auVar54 = vpmaxsd_avx(auVar41,auVar54);
              auVar41 = vpmaxsd_avx(auVar40,auVar70);
              auVar40 = vpmaxsd_avx(auVar60,auVar71);
              auVar40 = vpminsd_avx(auVar41,auVar40);
              auVar41 = vpmaxsd_avx(auVar34,auVar79);
              auVar40 = vpminsd_avx(auVar40,auVar41);
              auVar41 = vpmaxsd_avx(auVar54,(undefined1  [16])tray.tnear.field_0);
              auVar40 = vpminsd_avx(auVar40,(undefined1  [16])tray.tfar.field_0);
              auVar41 = vcmpps_avx(auVar41,auVar40,2);
              auVar46 = ZEXT1664(auVar41);
              sVar20 = sVar26;
              aVar5 = aVar99;
              if (((((auVar41 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                    (auVar41 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar41 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   auVar41[0xf] < '\0') &&
                 (aVar5.v = (__m128)vblendvps_avx(auVar97._0_16_,auVar54,auVar41), sVar20 = sVar2,
                 sVar26 != 8)) {
                pNVar31->ptr = sVar26;
                pNVar31 = pNVar31 + 1;
                *paVar28 = aVar99;
                paVar28 = paVar28 + 1;
              }
              aVar99 = aVar5;
              sVar26 = sVar20;
            }
            if (sVar26 == 8) goto LAB_0163a01c;
            auVar41 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar99,6);
            uVar23 = vmovmskps_avx(auVar41);
            root.ptr = sVar26;
          } while ((byte)uVar30 < (byte)POPCOUNT(uVar23));
          pNVar31->ptr = sVar26;
          pNVar31 = pNVar31 + 1;
          *paVar28 = aVar99;
          paVar28 = paVar28 + 1;
LAB_0163a01c:
          iVar24 = 4;
        }
        else {
          while (uVar33 != 0) {
            sVar26 = 0;
            for (uVar8 = uVar33; (uVar8 & 1) == 0; uVar8 = uVar8 >> 1 | 0x8000000000000000) {
              sVar26 = sVar26 + 1;
            }
            uVar33 = uVar33 - 1 & uVar33;
            auVar46 = ZEXT1664(auVar46._0_16_);
            bVar21 = occluded1(This,bvh,root,sVar26,&pre,ray,&tray,context);
            if (bVar21) {
              *(undefined4 *)(local_37c8 + sVar26 * 4 + -0x10) = 0xffffffff;
            }
          }
          auVar41 = _DAT_01f46b70 & ~(undefined1  [16])terminated.field_0;
          iVar24 = 3;
          auVar97 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          if ((((auVar41 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar41 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar41 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar41[0xf] < '\0') {
            auVar46 = ZEXT1664((undefined1  [16])tray.tfar.field_0);
            auVar54._8_4_ = 0xff800000;
            auVar54._0_8_ = 0xff800000ff800000;
            auVar54._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar54,
                               (undefined1  [16])terminated.field_0);
            iVar24 = 2;
          }
          if (uVar30 < uVar22) goto LAB_01639e9b;
        }
      } while (iVar24 != 3);
LAB_0163af15:
      auVar41 = vandps_avx(local_3688,(undefined1  [16])terminated.field_0);
      auVar45._8_4_ = 0xff800000;
      auVar45._0_8_ = 0xff800000ff800000;
      auVar45._12_4_ = 0xff800000;
      auVar41 = vmaskmovps_avx(auVar41,auVar45);
      *(undefined1 (*) [16])local_37f0 = auVar41;
    }
  }
  return;
LAB_0163a082:
  do {
    auVar41 = auVar46._0_16_;
    if (lVar27 == (ulong)((uint)root.ptr & 0xf) - 8) break;
    lVar29 = lVar27 * 0xe0 + (root.ptr & 0xfffffffffffffff0);
    lVar32 = 0;
    auVar54 = local_37a8;
    do {
      if (lVar32 == 4) break;
      uVar22 = *(uint *)(lVar25 + lVar32 * 4);
      if ((ulong)uVar22 == 0xffffffff) break;
      fVar69 = *(float *)(lVar25 + -0xc0 + lVar32 * 4);
      auVar80._4_4_ = fVar69;
      auVar80._0_4_ = fVar69;
      auVar80._8_4_ = fVar69;
      auVar80._12_4_ = fVar69;
      fVar76 = *(float *)(lVar25 + -0xb0 + lVar32 * 4);
      auVar85._4_4_ = fVar76;
      auVar85._0_4_ = fVar76;
      auVar85._8_4_ = fVar76;
      auVar85._12_4_ = fVar76;
      fVar77 = *(float *)(lVar25 + -0xa0 + lVar32 * 4);
      auVar62._4_4_ = fVar77;
      auVar62._0_4_ = fVar77;
      auVar62._8_4_ = fVar77;
      auVar62._12_4_ = fVar77;
      local_37c8._4_4_ = *(float *)(lVar25 + -0x90 + lVar32 * 4);
      local_3628 = *(float *)(lVar25 + -0x80 + lVar32 * 4);
      local_3638 = *(float *)(lVar25 + -0x70 + lVar32 * 4);
      local_3878._4_4_ = *(undefined4 *)(lVar25 + -0x60 + lVar32 * 4);
      local_3878._0_4_ = local_3878._4_4_;
      local_3878._8_4_ = local_3878._4_4_;
      local_3878._12_4_ = local_3878._4_4_;
      local_37e8._4_4_ = *(undefined4 *)(lVar25 + -0x50 + lVar32 * 4);
      local_37e8._0_4_ = local_37e8._4_4_;
      local_37e8._8_4_ = local_37e8._4_4_;
      local_37e8._12_4_ = local_37e8._4_4_;
      uVar23 = *(undefined4 *)(lVar25 + -0x40 + lVar32 * 4);
      local_3648 = *(float *)(lVar25 + -0x30 + lVar32 * 4);
      local_3658 = *(float *)(lVar25 + -0x20 + lVar32 * 4);
      local_3668 = *(float *)(lVar25 + -0x10 + lVar32 * 4);
      local_36b8 = *(undefined8 *)(lVar29 + 0xd0);
      uStack_36b0 = *(undefined8 *)(lVar29 + 0xd8);
      local_37c8._0_4_ = local_37c8._4_4_;
      fStack_37c0 = (float)local_37c8._4_4_;
      fStack_37bc = (float)local_37c8._4_4_;
      fVar6 = fVar69 - (float)local_37c8._4_4_;
      fStack_3634 = local_3638;
      fStack_3630 = local_3638;
      fStack_362c = local_3638;
      fVar7 = fVar77 - local_3638;
      auVar96._4_4_ = fVar7;
      auVar96._0_4_ = fVar7;
      auVar96._8_4_ = fVar7;
      auVar96._12_4_ = fVar7;
      fStack_3644 = local_3648;
      fStack_3640 = local_3648;
      fStack_363c = local_3648;
      fVar69 = local_3648 - fVar69;
      fVar78 = fVar7 * fVar69;
      auVar100._4_4_ = fVar69;
      auVar100._0_4_ = fVar69;
      auVar100._8_4_ = fVar69;
      auVar100._12_4_ = fVar69;
      auVar107._4_4_ = fVar6;
      auVar107._0_4_ = fVar6;
      auVar107._8_4_ = fVar6;
      auVar107._12_4_ = fVar6;
      fStack_3654 = local_3658;
      fStack_3650 = local_3658;
      fStack_364c = local_3658;
      fVar69 = local_3658 - fVar76;
      fVar6 = fVar6 * fVar69;
      auVar104._4_4_ = fVar69;
      auVar104._0_4_ = fVar69;
      auVar104._8_4_ = fVar69;
      auVar104._12_4_ = fVar69;
      fStack_3624 = local_3628;
      fStack_3620 = local_3628;
      fStack_361c = local_3628;
      fVar76 = fVar76 - local_3628;
      auVar73._4_4_ = fVar76;
      auVar73._0_4_ = fVar76;
      auVar73._8_4_ = fVar76;
      auVar73._12_4_ = fVar76;
      fStack_3664 = local_3668;
      fStack_3660 = local_3668;
      fStack_365c = local_3668;
      fVar77 = local_3668 - fVar77;
      fVar76 = fVar76 * fVar77;
      auVar105._4_4_ = fVar77;
      auVar105._0_4_ = fVar77;
      auVar105._8_4_ = fVar77;
      auVar105._12_4_ = fVar77;
      auVar34._4_4_ = fVar76;
      auVar34._0_4_ = fVar76;
      auVar34._8_4_ = fVar76;
      auVar34._12_4_ = fVar76;
      local_3758.field_0.x.field_0 = (vfloat_impl<4>)vfmsub231ps_fma(auVar34,auVar104,auVar96);
      auVar44._4_4_ = fVar78;
      auVar44._0_4_ = fVar78;
      auVar44._8_4_ = fVar78;
      auVar44._12_4_ = fVar78;
      local_3758.field_0.y.field_0 = (vfloat_impl<4>)vfmsub231ps_fma(auVar44,auVar105,auVar107);
      auVar48._4_4_ = fVar6;
      auVar48._0_4_ = fVar6;
      auVar48._8_4_ = fVar6;
      auVar48._12_4_ = fVar6;
      auVar34 = vsubps_avx(auVar80,*(undefined1 (*) [16])ray);
      auVar70 = vsubps_avx(auVar85,*(undefined1 (*) [16])(ray + 0x10));
      local_3758.field_0.z.field_0 = (vfloat_impl<4>)vfmsub231ps_fma(auVar48,auVar100,auVar73);
      auVar71 = vsubps_avx(auVar62,*(undefined1 (*) [16])(ray + 0x20));
      auVar41 = *(undefined1 (*) [16])(ray + 0x40);
      auVar40 = *(undefined1 (*) [16])(ray + 0x50);
      auVar108._0_4_ = auVar41._0_4_ * auVar70._0_4_;
      auVar108._4_4_ = auVar41._4_4_ * auVar70._4_4_;
      auVar108._8_4_ = auVar41._8_4_ * auVar70._8_4_;
      auVar108._12_4_ = auVar41._12_4_ * auVar70._12_4_;
      auVar94 = vfmsub231ps_fma(auVar108,auVar34,auVar40);
      auVar60 = *(undefined1 (*) [16])(ray + 0x60);
      auVar87._0_4_ = local_3758._32_4_ * auVar60._0_4_;
      auVar87._4_4_ = local_3758._36_4_ * auVar60._4_4_;
      auVar87._8_4_ = local_3758._40_4_ * auVar60._8_4_;
      auVar87._12_4_ = local_3758._44_4_ * auVar60._12_4_;
      auVar79 = vfmadd231ps_fma(auVar87,(undefined1  [16])local_3758.field_0.y.field_0,auVar40);
      auVar110._0_4_ = auVar71._0_4_ * auVar40._0_4_;
      auVar110._4_4_ = auVar71._4_4_ * auVar40._4_4_;
      auVar110._8_4_ = auVar71._8_4_ * auVar40._8_4_;
      auVar110._12_4_ = auVar71._12_4_ * auVar40._12_4_;
      auVar95 = vfmsub231ps_fma(auVar110,auVar70,auVar60);
      auVar55._0_4_ = auVar34._0_4_ * auVar60._0_4_;
      auVar55._4_4_ = auVar34._4_4_ * auVar60._4_4_;
      auVar55._8_4_ = auVar34._8_4_ * auVar60._8_4_;
      auVar55._12_4_ = auVar34._12_4_ * auVar60._12_4_;
      auVar44 = vfmsub231ps_fma(auVar55,auVar71,auVar41);
      auVar60 = vfmadd231ps_fma(auVar79,(undefined1  [16])local_3758.field_0.x.field_0,auVar41);
      auVar63._0_4_ = fVar77 * auVar94._0_4_;
      auVar63._4_4_ = fVar77 * auVar94._4_4_;
      auVar63._8_4_ = fVar77 * auVar94._8_4_;
      auVar63._12_4_ = fVar77 * auVar94._12_4_;
      auVar41 = vfmadd231ps_fma(auVar63,auVar44,auVar104);
      auVar40 = vfmadd231ps_fma(auVar41,auVar95,auVar100);
      local_3678._8_4_ = 0x80000000;
      local_3678._0_8_ = 0x8000000080000000;
      local_3678._12_4_ = 0x80000000;
      auVar41 = vandps_avx(auVar60,local_3678);
      uVar98 = auVar41._0_4_;
      auVar64._0_4_ = (float)(uVar98 ^ auVar40._0_4_);
      uVar101 = auVar41._4_4_;
      auVar64._4_4_ = (float)(uVar101 ^ auVar40._4_4_);
      uVar102 = auVar41._8_4_;
      auVar64._8_4_ = (float)(uVar102 ^ auVar40._8_4_);
      uVar103 = auVar41._12_4_;
      auVar64._12_4_ = (float)(uVar103 ^ auVar40._12_4_);
      auVar41 = vcmpps_avx(auVar64,_DAT_01f45a50,5);
      auVar40 = auVar54 & auVar41;
      if ((((auVar40 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar40 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar40 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar40[0xf] < '\0'
         ) {
        auVar41 = vandps_avx(auVar41,auVar54);
        auVar75._0_4_ = auVar94._0_4_ * fVar7;
        auVar75._4_4_ = auVar94._4_4_ * fVar7;
        auVar75._8_4_ = auVar94._8_4_ * fVar7;
        auVar75._12_4_ = auVar94._12_4_ * fVar7;
        auVar40 = vfmadd213ps_fma(auVar73,auVar44,auVar75);
        auVar40 = vfmadd213ps_fma(auVar107,auVar95,auVar40);
        auVar57._0_4_ = (float)(uVar98 ^ auVar40._0_4_);
        auVar57._4_4_ = (float)(uVar101 ^ auVar40._4_4_);
        auVar57._8_4_ = (float)(uVar102 ^ auVar40._8_4_);
        auVar57._12_4_ = (float)(uVar103 ^ auVar40._12_4_);
        auVar40 = vcmpps_avx(auVar57,_DAT_01f45a50,5);
        auVar79 = auVar41 & auVar40;
        if ((((auVar79 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar79 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar79 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar79[0xf] < '\0') {
          auVar79 = vandps_avx(auVar60,local_36c8);
          auVar41 = vandps_avx(auVar41,auVar40);
          auVar40 = vsubps_avx(auVar79,auVar64);
          auVar40 = vcmpps_avx(auVar40,auVar57,5);
          auVar94 = auVar41 & auVar40;
          if ((((auVar94 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar94 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar94 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar94[0xf] < '\0') {
            auVar41 = vandps_avx(auVar40,auVar41);
            auVar92._0_4_ = auVar71._0_4_ * local_3758._32_4_;
            auVar92._4_4_ = auVar71._4_4_ * local_3758._36_4_;
            auVar92._8_4_ = auVar71._8_4_ * local_3758._40_4_;
            auVar92._12_4_ = auVar71._12_4_ * local_3758._44_4_;
            auVar40 = vfmadd213ps_fma(auVar70,(undefined1  [16])local_3758.field_0.y.field_0,auVar92
                                     );
            auVar40 = vfmadd213ps_fma(auVar34,(undefined1  [16])local_3758.field_0.x.field_0,auVar40
                                     );
            auVar81._0_4_ = (float)(uVar98 ^ auVar40._0_4_);
            auVar81._4_4_ = (float)(uVar101 ^ auVar40._4_4_);
            auVar81._8_4_ = (float)(uVar102 ^ auVar40._8_4_);
            auVar81._12_4_ = (float)(uVar103 ^ auVar40._12_4_);
            auVar86._0_4_ = auVar79._0_4_ * *(float *)(ray + 0x30);
            auVar86._4_4_ = auVar79._4_4_ * *(float *)(ray + 0x34);
            auVar86._8_4_ = auVar79._8_4_ * *(float *)(ray + 0x38);
            auVar86._12_4_ = auVar79._12_4_ * *(float *)(ray + 0x3c);
            auVar93._0_4_ = auVar79._0_4_ * *(float *)(ray + 0x80);
            auVar93._4_4_ = auVar79._4_4_ * *(float *)(ray + 0x84);
            auVar93._8_4_ = auVar79._8_4_ * *(float *)(ray + 0x88);
            auVar93._12_4_ = auVar79._12_4_ * *(float *)(ray + 0x8c);
            auVar40 = vcmpps_avx(auVar86,auVar81,1);
            auVar34 = vcmpps_avx(auVar81,auVar93,2);
            auVar40 = vandps_avx(auVar34,auVar40);
            auVar34 = auVar41 & auVar40;
            if ((((auVar34 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar34 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar34 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar34[0xf] < '\0') {
              auVar41 = vandps_avx(auVar41,auVar40);
              auVar40 = vcmpps_avx(auVar60,_DAT_01f45a50,4);
              auVar60 = auVar41 & auVar40;
              if ((((auVar60 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar60 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar60 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar60[0xf] < '\0') {
                auVar41 = vandps_avx(auVar40,auVar41);
                local_37f8 = (context->scene->geometries).items[uVar22].ptr;
                uVar98 = local_37f8->mask;
                auVar89._4_4_ = uVar98;
                auVar89._0_4_ = uVar98;
                auVar89._8_4_ = uVar98;
                auVar89._12_4_ = uVar98;
                auVar40 = vpand_avx(auVar89,*(undefined1 (*) [16])(ray + 0x90));
                auVar40 = vpcmpeqd_avx(auVar40,_DAT_01f45a50);
                auVar60 = auVar41 & ~auVar40;
                if ((((auVar60 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar60 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar60 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar60[0xf] < '\0') {
                  uVar1 = *(undefined4 *)((long)&local_36b8 + lVar32 * 4);
                  local_3818 = vandnps_avx(auVar40,auVar41);
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (local_37f8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar41 = vrcpps_avx(auVar79);
                    auVar90._8_4_ = 0x3f800000;
                    auVar90._0_8_ = 0x3f8000003f800000;
                    auVar90._12_4_ = 0x3f800000;
                    auVar40 = vfnmadd213ps_fma(auVar79,auVar41,auVar90);
                    auVar41 = vfmadd132ps_fma(auVar40,auVar41,auVar41);
                    fVar69 = auVar41._0_4_;
                    local_3728._0_4_ = fVar69 * auVar81._0_4_;
                    fVar76 = auVar41._4_4_;
                    local_3728._4_4_ = fVar76 * auVar81._4_4_;
                    fVar77 = auVar41._8_4_;
                    fStack_3720 = fVar77 * auVar81._8_4_;
                    fVar78 = auVar41._12_4_;
                    fStack_371c = fVar78 * auVar81._12_4_;
                    auVar67._0_4_ = fVar69 * auVar64._0_4_;
                    auVar67._4_4_ = fVar76 * auVar64._4_4_;
                    auVar67._8_4_ = fVar77 * auVar64._8_4_;
                    auVar67._12_4_ = fVar78 * auVar64._12_4_;
                    auVar41 = vminps_avx(auVar67,auVar90);
                    auVar58._0_4_ = fVar69 * auVar57._0_4_;
                    auVar58._4_4_ = fVar76 * auVar57._4_4_;
                    auVar58._8_4_ = fVar77 * auVar57._8_4_;
                    auVar58._12_4_ = fVar78 * auVar57._12_4_;
                    auVar40 = vminps_avx(auVar58,auVar90);
                    auVar60 = vsubps_avx(auVar90,auVar41);
                    auVar34 = vsubps_avx(auVar90,auVar40);
                    auVar11._8_8_ = uStack_3690;
                    auVar11._0_8_ = local_3698;
                    local_3708 = vblendvps_avx(auVar41,auVar60,auVar11);
                    local_3718 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                 vblendvps_avx(auVar40,auVar34,auVar11);
                    args.valid = (int *)&Ng;
                    args.geometryUserPtr = &t;
                    args.context = (RTCRayQueryContext *)&v;
                    args.ray = (RTCRayN *)&u;
                    std::
                    _Tuple_impl<0ul,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::Vec3<embree::vfloat_impl<4>>&>
                    ::
                    _M_assign<embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::Vec3<embree::vfloat_impl<4>>>
                              ((_Tuple_impl<0UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                                *)&args,(_Tuple_impl<0UL,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::Vec3<embree::vfloat_impl<4>_>_>
                                         *)&local_3758.field_0);
                    local_36f8._4_4_ = uVar22;
                    local_36f8._0_4_ = uVar22;
                    local_36f8._8_4_ = uVar22;
                    local_36f8._12_4_ = uVar22;
                    local_3718 = v.field_0;
                    local_3708._4_4_ = uVar1;
                    local_3708._0_4_ = uVar1;
                    local_3708._8_4_ = uVar1;
                    local_3708._12_4_ = uVar1;
                    vpcmpeqd_avx2(ZEXT1632(local_36f8),ZEXT1632(local_36f8));
                    uStack_36e4 = context->user->instID[0];
                    local_36e8 = uStack_36e4;
                    uStack_36e0 = uStack_36e4;
                    uStack_36dc = uStack_36e4;
                    uStack_36d8 = context->user->instPrimID[0];
                    uStack_36d4 = uStack_36d8;
                    uStack_36d0 = uStack_36d8;
                    uStack_36cc = uStack_36d8;
                    auVar41 = *(undefined1 (*) [16])(ray + 0x80);
                    auVar40 = vblendvps_avx(auVar41,(undefined1  [16])t.field_0,local_3818);
                    *(undefined1 (*) [16])(ray + 0x80) = auVar40;
                    args.valid = (int *)local_3808;
                    args.geometryUserPtr = local_37f8->userPtr;
                    args.context = context->user;
                    args.hit = (RTCHitN *)&local_3758;
                    args.N = 4;
                    args.ray = (RTCRayN *)ray;
                    local_3808 = local_3818;
                    if (local_37f8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      (*local_37f8->occlusionFilterN)(&args);
                    }
                    if (local_3808 == (undefined1  [16])0x0) {
                      auVar40 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                      auVar40 = auVar40 ^ _DAT_01f46b70;
                    }
                    else {
                      p_Var4 = context->args->filter;
                      if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((local_37f8->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var4)(&args);
                      }
                      auVar60 = vpcmpeqd_avx(local_3808,_DAT_01f45a50);
                      auVar40 = auVar60 ^ _DAT_01f46b70;
                      auVar51._8_4_ = 0xff800000;
                      auVar51._0_8_ = 0xff800000ff800000;
                      auVar51._12_4_ = 0xff800000;
                      auVar60 = vblendvps_avx(auVar51,*(undefined1 (*) [16])(args.ray + 0x80),
                                              auVar60);
                      *(undefined1 (*) [16])(args.ray + 0x80) = auVar60;
                    }
                    auVar40 = vpslld_avx(auVar40,0x1f);
                    local_3818 = vpsrad_avx(auVar40,0x1f);
                    auVar41 = vblendvps_avx(auVar41,*(undefined1 (*) [16])local_37f0,auVar40);
                    *(undefined1 (*) [16])local_37f0 = auVar41;
                  }
                  auVar54 = vandnps_avx(local_3818,auVar54);
                }
              }
            }
          }
        }
      }
      if ((((auVar54 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar54 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar54 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar54[0xf])
      {
        auVar97 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
        break;
      }
      auVar14._4_4_ = fStack_3644;
      auVar14._0_4_ = local_3648;
      auVar14._8_4_ = fStack_3640;
      auVar14._12_4_ = fStack_363c;
      auVar34 = vsubps_avx(local_3878,auVar14);
      auVar13._4_4_ = fStack_3654;
      auVar13._0_4_ = local_3658;
      auVar13._8_4_ = fStack_3650;
      auVar13._12_4_ = fStack_364c;
      auVar70 = vsubps_avx(local_37e8,auVar13);
      auVar9._4_4_ = uVar23;
      auVar9._0_4_ = uVar23;
      auVar9._8_4_ = uVar23;
      auVar9._12_4_ = uVar23;
      auVar12._4_4_ = fStack_3664;
      auVar12._0_4_ = local_3668;
      auVar12._8_4_ = fStack_3660;
      auVar12._12_4_ = fStack_365c;
      auVar71 = vsubps_avx(auVar9,auVar12);
      auVar79 = vsubps_avx(_local_37c8,local_3878);
      auVar16._4_4_ = fStack_3624;
      auVar16._0_4_ = local_3628;
      auVar16._8_4_ = fStack_3620;
      auVar16._12_4_ = fStack_361c;
      auVar94 = vsubps_avx(auVar16,local_37e8);
      auVar15._4_4_ = fStack_3634;
      auVar15._0_4_ = local_3638;
      auVar15._8_4_ = fStack_3630;
      auVar15._12_4_ = fStack_362c;
      auVar95 = vsubps_avx(auVar15,auVar9);
      auVar49._0_4_ = auVar70._0_4_ * auVar95._0_4_;
      auVar49._4_4_ = auVar70._4_4_ * auVar95._4_4_;
      auVar49._8_4_ = auVar70._8_4_ * auVar95._8_4_;
      auVar49._12_4_ = auVar70._12_4_ * auVar95._12_4_;
      local_3758.field_0.x.field_0 = (vfloat_impl<4>)vfmsub231ps_fma(auVar49,auVar94,auVar71);
      auVar74._0_4_ = auVar71._0_4_ * auVar79._0_4_;
      auVar74._4_4_ = auVar71._4_4_ * auVar79._4_4_;
      auVar74._8_4_ = auVar71._8_4_ * auVar79._8_4_;
      auVar74._12_4_ = auVar71._12_4_ * auVar79._12_4_;
      local_3758.field_0.y.field_0 = (vfloat_impl<4>)vfmsub231ps_fma(auVar74,auVar95,auVar34);
      auVar65._0_4_ = auVar94._0_4_ * auVar34._0_4_;
      auVar65._4_4_ = auVar94._4_4_ * auVar34._4_4_;
      auVar65._8_4_ = auVar94._8_4_ * auVar34._8_4_;
      auVar65._12_4_ = auVar94._12_4_ * auVar34._12_4_;
      auVar44 = vsubps_avx(local_3878,*(undefined1 (*) [16])ray);
      auVar48 = vsubps_avx(local_37e8,*(undefined1 (*) [16])(ray + 0x10));
      auVar55 = vsubps_avx(auVar9,*(undefined1 (*) [16])(ray + 0x20));
      auVar63 = vfmsub231ps_fma(auVar65,auVar79,auVar70);
      auVar41 = *(undefined1 (*) [16])(ray + 0x40);
      auVar40 = *(undefined1 (*) [16])(ray + 0x50);
      auVar106._0_4_ = auVar48._0_4_ * auVar41._0_4_;
      auVar106._4_4_ = auVar48._4_4_ * auVar41._4_4_;
      auVar106._8_4_ = auVar48._8_4_ * auVar41._8_4_;
      auVar106._12_4_ = auVar48._12_4_ * auVar41._12_4_;
      auVar64 = vfmsub231ps_fma(auVar106,auVar44,auVar40);
      auVar60 = *(undefined1 (*) [16])(ray + 0x60);
      auVar88._0_4_ = auVar60._0_4_ * auVar63._0_4_;
      auVar88._4_4_ = auVar60._4_4_ * auVar63._4_4_;
      auVar88._8_4_ = auVar60._8_4_ * auVar63._8_4_;
      auVar88._12_4_ = auVar60._12_4_ * auVar63._12_4_;
      auVar62 = vfmadd231ps_fma(auVar88,(undefined1  [16])local_3758.field_0.y.field_0,auVar40);
      auVar109._0_4_ = auVar40._0_4_ * auVar55._0_4_;
      auVar109._4_4_ = auVar40._4_4_ * auVar55._4_4_;
      auVar109._8_4_ = auVar40._8_4_ * auVar55._8_4_;
      auVar109._12_4_ = auVar40._12_4_ * auVar55._12_4_;
      auVar73 = vfmsub231ps_fma(auVar109,auVar48,auVar60);
      auVar111._0_4_ = auVar60._0_4_ * auVar44._0_4_;
      auVar111._4_4_ = auVar60._4_4_ * auVar44._4_4_;
      auVar111._8_4_ = auVar60._8_4_ * auVar44._8_4_;
      auVar111._12_4_ = auVar60._12_4_ * auVar44._12_4_;
      auVar80 = vfmsub231ps_fma(auVar111,auVar55,auVar41);
      auVar60 = vfmadd231ps_fma(auVar62,(undefined1  [16])local_3758.field_0.x.field_0,auVar41);
      auVar35._0_4_ = auVar95._0_4_ * auVar64._0_4_;
      auVar35._4_4_ = auVar95._4_4_ * auVar64._4_4_;
      auVar35._8_4_ = auVar95._8_4_ * auVar64._8_4_;
      auVar35._12_4_ = auVar95._12_4_ * auVar64._12_4_;
      auVar40 = vfmadd231ps_fma(auVar35,auVar80,auVar94);
      auVar41 = vandps_avx(auVar60,local_3678);
      auVar40 = vfmadd231ps_fma(auVar40,auVar73,auVar79);
      uVar22 = auVar41._0_4_;
      auVar56._0_4_ = (float)(uVar22 ^ auVar40._0_4_);
      uVar98 = auVar41._4_4_;
      auVar56._4_4_ = (float)(uVar98 ^ auVar40._4_4_);
      uVar101 = auVar41._8_4_;
      auVar56._8_4_ = (float)(uVar101 ^ auVar40._8_4_);
      uVar102 = auVar41._12_4_;
      auVar56._12_4_ = (float)(uVar102 ^ auVar40._12_4_);
      auVar41 = vcmpps_avx(auVar56,_DAT_01f45a50,5);
      auVar40 = auVar54 & auVar41;
      if ((((auVar40 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar40 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar40 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar40[0xf] < '\0'
         ) {
        auVar41 = vandps_avx(auVar41,auVar54);
        auVar36._0_4_ = auVar71._0_4_ * auVar64._0_4_;
        auVar36._4_4_ = auVar71._4_4_ * auVar64._4_4_;
        auVar36._8_4_ = auVar71._8_4_ * auVar64._8_4_;
        auVar36._12_4_ = auVar71._12_4_ * auVar64._12_4_;
        auVar40 = vfmadd213ps_fma(auVar70,auVar80,auVar36);
        auVar40 = vfmadd213ps_fma(auVar34,auVar73,auVar40);
        auVar66._0_4_ = (float)(uVar22 ^ auVar40._0_4_);
        auVar66._4_4_ = (float)(uVar98 ^ auVar40._4_4_);
        auVar66._8_4_ = (float)(uVar101 ^ auVar40._8_4_);
        auVar66._12_4_ = (float)(uVar102 ^ auVar40._12_4_);
        auVar40 = vcmpps_avx(auVar66,_DAT_01f45a50,5);
        auVar34 = auVar41 & auVar40;
        local_37e8 = auVar63;
        if ((((auVar34 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar34 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar34 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar34[0xf] < '\0') {
          auVar34 = vandps_avx(auVar60,local_36c8);
          auVar41 = vandps_avx(auVar40,auVar41);
          auVar40 = vsubps_avx(auVar34,auVar56);
          auVar40 = vcmpps_avx(auVar40,auVar66,5);
          auVar70 = auVar41 & auVar40;
          if ((((auVar70 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar70 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar70 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar70[0xf] < '\0') {
            auVar41 = vandps_avx(auVar40,auVar41);
            auVar37._0_4_ = auVar55._0_4_ * auVar63._0_4_;
            auVar37._4_4_ = auVar55._4_4_ * auVar63._4_4_;
            auVar37._8_4_ = auVar55._8_4_ * auVar63._8_4_;
            auVar37._12_4_ = auVar55._12_4_ * auVar63._12_4_;
            auVar40 = vfmadd213ps_fma(auVar48,(undefined1  [16])local_3758.field_0.y.field_0,auVar37
                                     );
            auVar40 = vfmadd213ps_fma(auVar44,(undefined1  [16])local_3758.field_0.x.field_0,auVar40
                                     );
            auVar50._0_4_ = (float)(uVar22 ^ auVar40._0_4_);
            auVar50._4_4_ = (float)(uVar98 ^ auVar40._4_4_);
            auVar50._8_4_ = (float)(uVar101 ^ auVar40._8_4_);
            auVar50._12_4_ = (float)(uVar102 ^ auVar40._12_4_);
            auVar38._0_4_ = auVar34._0_4_ * *(float *)(ray + 0x30);
            auVar38._4_4_ = auVar34._4_4_ * *(float *)(ray + 0x34);
            auVar38._8_4_ = auVar34._8_4_ * *(float *)(ray + 0x38);
            auVar38._12_4_ = auVar34._12_4_ * *(float *)(ray + 0x3c);
            auVar82._0_4_ = auVar34._0_4_ * *(float *)(ray + 0x80);
            auVar82._4_4_ = auVar34._4_4_ * *(float *)(ray + 0x84);
            auVar82._8_4_ = auVar34._8_4_ * *(float *)(ray + 0x88);
            auVar82._12_4_ = auVar34._12_4_ * *(float *)(ray + 0x8c);
            auVar40 = vcmpps_avx(auVar38,auVar50,1);
            auVar70 = vcmpps_avx(auVar50,auVar82,2);
            auVar40 = vandps_avx(auVar70,auVar40);
            auVar70 = auVar41 & auVar40;
            if ((((auVar70 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar70 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar70 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar70[0xf] < '\0') {
              auVar41 = vandps_avx(auVar41,auVar40);
              auVar40 = vcmpps_avx(auVar60,_DAT_01f45a50,4);
              auVar60 = auVar41 & auVar40;
              if ((((auVar60 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar60 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar60 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar60[0xf] < '\0') {
                auVar41 = vandps_avx(auVar40,auVar41);
                uVar98 = *(uint *)(lVar25 + lVar32 * 4);
                pGVar3 = (context->scene->geometries).items[uVar98].ptr;
                uVar22 = pGVar3->mask;
                auVar39._4_4_ = uVar22;
                auVar39._0_4_ = uVar22;
                auVar39._8_4_ = uVar22;
                auVar39._12_4_ = uVar22;
                auVar40 = vpand_avx(auVar39,*(undefined1 (*) [16])(ray + 0x90));
                auVar40 = vpcmpeqd_avx(auVar40,_DAT_01f45a50);
                auVar60 = auVar41 & ~auVar40;
                if ((((auVar60 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar60 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar60 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar60[0xf] < '\0') {
                  uVar23 = *(undefined4 *)((long)&local_36b8 + lVar32 * 4);
                  local_3878 = vandnps_avx(auVar40,auVar41);
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar41 = vrcpps_avx(auVar34);
                    auVar83._8_4_ = 0x3f800000;
                    auVar83._0_8_ = 0x3f8000003f800000;
                    auVar83._12_4_ = 0x3f800000;
                    auVar40 = vfnmadd213ps_fma(auVar34,auVar41,auVar83);
                    auVar41 = vfmadd132ps_fma(auVar40,auVar41,auVar41);
                    fVar69 = auVar41._0_4_;
                    fVar76 = auVar41._4_4_;
                    fVar77 = auVar41._8_4_;
                    fVar78 = auVar41._12_4_;
                    auVar59._0_4_ = fVar69 * auVar56._0_4_;
                    auVar59._4_4_ = fVar76 * auVar56._4_4_;
                    auVar59._8_4_ = fVar77 * auVar56._8_4_;
                    auVar59._12_4_ = fVar78 * auVar56._12_4_;
                    auVar41 = vminps_avx(auVar59,auVar83);
                    auVar68._0_4_ = fVar69 * auVar66._0_4_;
                    auVar68._4_4_ = fVar76 * auVar66._4_4_;
                    auVar68._8_4_ = fVar77 * auVar66._8_4_;
                    auVar68._12_4_ = fVar78 * auVar66._12_4_;
                    auVar40 = vminps_avx(auVar68,auVar83);
                    auVar60 = vsubps_avx(auVar83,auVar41);
                    auVar34 = vsubps_avx(auVar83,auVar40);
                    auVar10._8_8_ = uStack_36a0;
                    auVar10._0_8_ = local_36a8;
                    local_3708 = vblendvps_avx(auVar41,auVar60,auVar10);
                    local_3718 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                 vblendvps_avx(auVar40,auVar34,auVar10);
                    local_37e8._0_8_ = auVar63._0_8_;
                    local_37e8._8_8_ = auVar63._8_8_;
                    local_3758._32_8_ = local_37e8._0_8_;
                    local_3758._40_8_ = local_37e8._8_8_;
                    local_3728._4_4_ = fVar76 * auVar50._4_4_;
                    local_3728._0_4_ = fVar69 * auVar50._0_4_;
                    fStack_3720 = fVar77 * auVar50._8_4_;
                    fStack_371c = fVar78 * auVar50._12_4_;
                    args.valid = (int *)&Ng;
                    args.geometryUserPtr = &t;
                    args.context = (RTCRayQueryContext *)&v;
                    args.ray = (RTCRayN *)&u;
                    std::
                    _Tuple_impl<0ul,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::Vec3<embree::vfloat_impl<4>>&>
                    ::
                    _M_assign<embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::Vec3<embree::vfloat_impl<4>>>
                              ((_Tuple_impl<0UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                                *)&args,(_Tuple_impl<0UL,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::Vec3<embree::vfloat_impl<4>_>_>
                                         *)&local_3758.field_0);
                    local_36f8._4_4_ = uVar98;
                    local_36f8._0_4_ = uVar98;
                    local_36f8._8_4_ = uVar98;
                    local_36f8._12_4_ = uVar98;
                    local_3718 = v.field_0;
                    local_3708._4_4_ = uVar23;
                    local_3708._0_4_ = uVar23;
                    local_3708._8_4_ = uVar23;
                    local_3708._12_4_ = uVar23;
                    vpcmpeqd_avx2(ZEXT1632(local_36f8),ZEXT1632(local_36f8));
                    uStack_36e4 = context->user->instID[0];
                    local_36e8 = uStack_36e4;
                    uStack_36e0 = uStack_36e4;
                    uStack_36dc = uStack_36e4;
                    uStack_36d8 = context->user->instPrimID[0];
                    uStack_36d4 = uStack_36d8;
                    uStack_36d0 = uStack_36d8;
                    uStack_36cc = uStack_36d8;
                    local_37e8 = *(undefined1 (*) [16])(ray + 0x80);
                    auVar41 = vblendvps_avx(local_37e8,(undefined1  [16])t.field_0,local_3878);
                    *(undefined1 (*) [16])(ray + 0x80) = auVar41;
                    args.valid = (int *)local_3808;
                    args.geometryUserPtr = pGVar3->userPtr;
                    args.context = context->user;
                    args.hit = (RTCHitN *)&local_3758;
                    args.N = 4;
                    args.ray = (RTCRayN *)ray;
                    local_3808 = local_3878;
                    if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar3->occlusionFilterN)(&args);
                    }
                    if (local_3808 == (undefined1  [16])0x0) {
                      auVar41 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                      auVar41 = auVar41 ^ _DAT_01f46b70;
                    }
                    else {
                      p_Var4 = context->args->filter;
                      if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var4)(&args);
                      }
                      auVar40 = vpcmpeqd_avx(local_3808,_DAT_01f45a50);
                      auVar41 = auVar40 ^ _DAT_01f46b70;
                      auVar52._8_4_ = 0xff800000;
                      auVar52._0_8_ = 0xff800000ff800000;
                      auVar52._12_4_ = 0xff800000;
                      auVar40 = vblendvps_avx(auVar52,*(undefined1 (*) [16])(args.ray + 0x80),
                                              auVar40);
                      *(undefined1 (*) [16])(args.ray + 0x80) = auVar40;
                    }
                    auVar41 = vpslld_avx(auVar41,0x1f);
                    local_3878 = vpsrad_avx(auVar41,0x1f);
                    auVar41 = vblendvps_avx(local_37e8,*(undefined1 (*) [16])local_37f0,auVar41);
                    *(undefined1 (*) [16])local_37f0 = auVar41;
                  }
                  auVar54 = vandnps_avx(local_3878,auVar54);
                }
              }
            }
          }
        }
      }
      lVar32 = lVar32 + 1;
      auVar97 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
    } while ((((auVar54 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
              (auVar54 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar54 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             auVar54[0xf] < '\0');
    auVar46 = ZEXT1664(local_37a8);
    auVar40 = vandps_avx(auVar54,local_37a8);
    lVar27 = lVar27 + 1;
    lVar25 = lVar25 + 0xe0;
    auVar54 = local_37a8 & auVar54;
    auVar41 = local_37a8;
    local_37a8 = auVar40;
  } while ((((auVar54 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
            (auVar54 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar54 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           auVar54[0xf] < '\0');
  auVar41 = vpcmpeqd_avx(auVar41,auVar41);
  auVar42._0_4_ = local_37a8._0_4_ ^ auVar41._0_4_;
  auVar42._4_4_ = local_37a8._4_4_ ^ auVar41._4_4_;
  auVar42._8_4_ = local_37a8._8_4_ ^ auVar41._8_4_;
  auVar42._12_4_ = local_37a8._12_4_ ^ auVar41._12_4_;
  terminated.field_0 =
       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
       vorps_avx(auVar42,(undefined1  [16])terminated.field_0);
  auVar41 = auVar41 & ~(undefined1  [16])terminated.field_0;
  if ((((auVar41 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar41 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar41 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar41[0xf])
  goto LAB_0163af15;
  auVar46 = ZEXT1664((undefined1  [16])tray.tfar.field_0);
  auVar53._8_4_ = 0xff800000;
  auVar53._0_8_ = 0xff800000ff800000;
  auVar53._12_4_ = 0xff800000;
  tray.tfar.field_0 =
       (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
       vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar53,
                     (undefined1  [16])terminated.field_0);
  goto LAB_01639e5c;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }